

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

size_t itemUsage(FILE *fp,columns_t columns,poptItem item,wchar_t nitems,char *translation_domain)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  
  uVar2 = _poptArgMask;
  if (L'\0' < nitems && item != (poptItem)0x0) {
    do {
      uVar1 = (item->option).argInfo;
      if ((uVar2 & uVar1) != 6) {
        if ((item->option).longName == (char *)0x0) {
          if (((uVar1 >> 0x1e & 1) == 0) && ((item->option).shortName != '\0')) goto LAB_001069ff;
        }
        else if ((uVar1 >> 0x1e & 1) == 0) {
LAB_001069ff:
          sVar3 = singleOptionUsage(fp,columns,&item->option,(char *)(ulong)uVar1);
          columns->cur = sVar3;
          uVar2 = _poptArgMask;
        }
      }
      item = item + 1;
      nitems = nitems + L'\xffffffff';
    } while (nitems != L'\0');
  }
  return columns->cur;
}

Assistant:

static size_t itemUsage(FILE * fp, columns_t columns,
		poptItem item, int nitems,
		const char * translation_domain)
{
    int i;

    if (item != NULL)
    for (i = 0; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
        if (poptArgType(opt) == POPT_ARG_INTL_DOMAIN) {
	    translation_domain = (const char *)opt->arg;
	} else
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN)) {
	    columns->cur = singleOptionUsage(fp, columns, opt, translation_domain);
	}
    }

    return columns->cur;
}